

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

int plat_walker(char *name,void *arg)

{
  undefined4 uVar1;
  int rv;
  walkdata *w;
  void *arg_local;
  char *name_local;
  
  uVar1 = (**arg)(name,*(undefined8 *)((long)arg + 8));
  switch(uVar1) {
  case 0:
    name_local._4_4_ = 0;
    break;
  case 1:
    name_local._4_4_ = 1;
    break;
  case 2:
    name_local._4_4_ = 2;
    break;
  case 3:
    name_local._4_4_ = 3;
    break;
  default:
    name_local._4_4_ = 1;
  }
  return name_local._4_4_;
}

Assistant:

static int
plat_walker(const char *name, void *arg)
{
	struct walkdata *w = arg;
	int              rv;

	rv = w->fn(name, w->arg);
	switch (rv) {
	case NNI_FILE_WALK_CONTINUE:
		return (NNI_PLAT_FILE_WALK_CONTINUE);
	case NNI_FILE_WALK_STOP:
		return (NNI_PLAT_FILE_WALK_STOP);
	case NNI_FILE_WALK_PRUNE_CHILD:
		return (NNI_PLAT_FILE_WALK_PRUNE_CHILD);
	case NNI_FILE_WALK_PRUNE_SIB:
		return (NNI_PLAT_FILE_WALK_PRUNE_SIB);
	}
	// We treat any other value as a stop condition.  The program
	// is returning something invalid.
	return (NNI_PLAT_FILE_WALK_STOP);
}